

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O3

parser_error parse_mcat_include_flag(parser *p)

{
  _Bool _Var1;
  errr eVar2;
  long *plVar3;
  char *pcVar4;
  char *flag_name;
  parser_error pVar5;
  
  plVar3 = (long *)parser_priv(p);
  if (plVar3 == (long *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-knowledge.c"
                  ,0xcce,"enum parser_error parse_mcat_include_flag(struct parser *)");
  }
  if (*plVar3 == 0) {
    pVar5 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    _Var1 = parser_hasval(p,"flags");
    pVar5 = PARSE_ERROR_NONE;
    if (_Var1) {
      pcVar4 = parser_getstr(p,"flags");
      pcVar4 = string_make(pcVar4);
      flag_name = strtok(pcVar4," |");
      if (flag_name == (char *)0x0) {
        pVar5 = PARSE_ERROR_NONE;
      }
      else {
        do {
          eVar2 = grab_flag((bitflag *)(*plVar3 + 0x18),0xc,r_info_flags,flag_name);
          if (eVar2 != 0) {
            pVar5 = PARSE_ERROR_INVALID_FLAG;
            break;
          }
          pVar5 = PARSE_ERROR_NONE;
          flag_name = strtok((char *)0x0," |");
        } while (flag_name != (char *)0x0);
      }
      string_free(pcVar4);
    }
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_mcat_include_flag(struct parser *p)
{
	struct ui_knowledge_parse_state *s =
		(struct ui_knowledge_parse_state*) parser_priv(p);
	char *flags, *next_flag;

	assert(s);
	if (!s->categories) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}

	if (!parser_hasval(p, "flags")) {
		return PARSE_ERROR_NONE;
	}
	flags = string_make(parser_getstr(p, "flags"));
	next_flag = strtok(flags, " |");
	while (next_flag) {
		if (grab_flag(s->categories->inc_flags, RF_SIZE, r_info_flags,
				next_flag)) {
			string_free(flags);
			return PARSE_ERROR_INVALID_FLAG;
		}
		next_flag = strtok(NULL, " |");
	}
	string_free(flags);

	return PARSE_ERROR_NONE;
}